

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O0

Clause * __thiscall
Saturation::PredicateSplitPassiveClauseContainer::popSelected
          (PredicateSplitPassiveClauseContainer *this)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  reference puVar5;
  ulong uVar6;
  size_type sVar7;
  pointer pPVar8;
  SingleParamEvent<Kernel::Clause_*> *this_00;
  SingleParamEvent<Kernel::Clause_*> *pSVar9;
  undefined4 extraout_var;
  Clause *pCVar10;
  long in_RDI;
  uint i;
  Clause *cl;
  uint currIndex;
  uint *balance;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  uint minElement;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  minElementIt;
  uint toss;
  uint queueIndex;
  Clause *in_stack_ffffffffffffff58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffff60;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  byte bVar11;
  undefined4 in_stack_ffffffffffffff78;
  value_type vVar12;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar13;
  uint local_74;
  uint local_64;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  long local_48;
  uint *local_40;
  uint *local_38;
  uint local_2c;
  uint *local_28;
  uint *local_20;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_18;
  uint local_10;
  uint local_c;
  
  if ((*(byte *)(in_RDI + 0x58) & 1) == 0) {
    local_20 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_ffffffffffffff58);
    local_28 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_ffffffffffffff58);
    __first_00._M_current._4_4_ = in_stack_ffffffffffffff7c;
    __first_00._M_current._0_4_ = in_stack_ffffffffffffff78;
    __last._M_current._7_1_ = in_stack_ffffffffffffff77;
    __last._M_current._0_7_ = in_stack_ffffffffffffff70;
    local_18 = std::
               min_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                         (__first_00,__last);
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_18);
    local_2c = *puVar5;
    local_38 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_ffffffffffffff58);
    local_40 = local_18._M_current;
    __first._M_current._7_1_ = in_stack_ffffffffffffff77;
    __first._M_current._0_7_ = in_stack_ffffffffffffff70;
    uVar6 = std::
            distance<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                      (__first,in_stack_ffffffffffffff68);
    local_c = (uint)uVar6;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xb0),
                        uVar6 & 0xffffffff);
    vVar12 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 200),
                        (ulong)local_c);
    *pvVar4 = vVar12 + *pvVar4;
    local_48 = in_RDI + 200;
    local_50._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_ffffffffffffff58);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff60,
                              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_50);
      *puVar5 = *puVar5 - local_2c;
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_50);
    }
  }
  else {
    local_10 = Lib::Random::getInteger((int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    local_c = 0;
    while (uVar13 = local_10,
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x60)
                              ,(ulong)local_c), *pvVar4 <= uVar13) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x60),
                          (ulong)local_c);
      local_10 = local_10 - *pvVar4;
      local_c = local_c + 1;
    }
  }
  local_64 = local_c;
  while( true ) {
    uVar6 = (ulong)local_64;
    sVar7 = std::
            vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
            ::size((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                    *)(in_RDI + 0x80));
    bVar11 = 0;
    if ((long)uVar6 < (long)sVar7) {
      std::
      vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
      ::operator[]((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                    *)(in_RDI + 0x80),(ulong)local_64);
      pPVar8 = std::
               unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
               ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                             *)0xac9bd9);
      iVar2 = (*(pPVar8->super_RandomAccessClauseContainer).super_ClauseContainer.
                _vptr_ClauseContainer[5])();
      bVar11 = (byte)iVar2;
    }
    if ((bVar11 & 1) == 0) break;
    local_64 = local_64 + 1;
  }
  this_00 = (SingleParamEvent<Kernel::Clause_*> *)(ulong)local_64;
  pSVar9 = (SingleParamEvent<Kernel::Clause_*> *)
           std::
           vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
           ::size((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                   *)(in_RDI + 0x80));
  uVar13 = local_c;
  if (this_00 == pSVar9) {
    do {
      local_64 = uVar13 - 1;
      std::
      vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
      ::operator[]((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                    *)(in_RDI + 0x80),(ulong)local_64);
      pPVar8 = std::
               unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
               ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                             *)0xac9c51);
      uVar3 = (*(pPVar8->super_RandomAccessClauseContainer).super_ClauseContainer.
                _vptr_ClauseContainer[5])();
      uVar13 = local_64;
    } while ((uVar3 & 1) != 0);
  }
  std::
  vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
  ::operator[]((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                *)(in_RDI + 0x80),(ulong)local_64);
  pPVar8 = std::
           unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
           ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                         *)0xac9c8e);
  iVar2 = (*(pPVar8->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer
            [6])();
  if ((*(byte *)(in_RDI + 0xe0) & 1) != 0) {
    local_74 = 0;
    while( true ) {
      in_stack_ffffffffffffff58 = (Clause *)(ulong)local_74;
      pCVar10 = (Clause *)
                std::
                vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                ::size((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                        *)(in_RDI + 0x80));
      if (pCVar10 <= in_stack_ffffffffffffff58) break;
      std::
      vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
      ::operator[]((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                    *)(in_RDI + 0x80),(ulong)local_74);
      pPVar8 = std::
               unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
               ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                             *)0xac9cf9);
      (*(pPVar8->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer[4])
                (pPVar8,(Clause *)CONCAT44(extraout_var,iVar2));
      local_74 = local_74 + 1;
    }
  }
  Lib::SingleParamEvent<Kernel::Clause_*>::fire(this_00,in_stack_ffffffffffffff58);
  return (Clause *)CONCAT44(extraout_var,iVar2);
}

Assistant:

Clause* PredicateSplitPassiveClauseContainer::popSelected()
{
  unsigned queueIndex;

  if (_randomize) {
    unsigned toss = Random::getInteger(_ratioSum);
    // cout << "metaqueue " << _name << " toss " << toss << " (below: " << _ratioSum << ")";
    queueIndex = 0;
    while (toss >= _ratios[queueIndex]) {
      toss -= _ratios[queueIndex];
      queueIndex++;
    }
    // cout << " means " << queueIndex << " (below: " << _ratios.size() << ")" << endl;
  } else {
    // compute queue from which we will pick a clause:
    // choose queue using weighted round robin
    auto minElementIt = std::min_element(_balances.begin(), _balances.end());
    auto minElement = *minElementIt; // need to save the value of the min element before updating it to a new value, since it may not remain the minimal element after the update

    queueIndex = std::distance(_balances.begin(), minElementIt);

    _balances[queueIndex] += _invertedRatios[queueIndex];
    for (auto& balance : _balances)
    {
      balance -= minElement;
    }
  }

  // if chosen queue is empty, use the next queue to the right
  // this succeeds in a multi-split-queue-non-LRS-setting where we have the invariant that each clause from queue i is contained in queue j if i<j
  auto currIndex = queueIndex;
  while (currIndex < (long int)_queues.size() && _queues[currIndex]->isEmpty())
  {
    currIndex++;
  }
  // for tammet-style-queues or in the presence of LRS, we need to also consider the queues to the left as additional fallback (using the invar: at least one queue has at least one clause if popSelected is called)
  if (currIndex == (long int)_queues.size())
  {
    // fallback: try remaining queues, at least one of them must be nonempty
    ASS(queueIndex > 0); // otherwise we would already have searched through all queues
    currIndex = queueIndex - 1;
    while (_queues[currIndex]->isEmpty())
    {
      currIndex--;
      ASS(currIndex >= 0);
    }
  }
  ASS(!_queues[currIndex]->isEmpty());

  // pop clause from selected queue
  auto cl = _queues[currIndex]->popSelected();
  ASS(cl->store() == Clause::PASSIVE);

  // note: for a non-layered arrangement, the clause only occured in _queues[currIndex] (from which it was just removed using popSelected(), so we don't need any additional clause-removal
  if (_layeredArrangement)
  {
    // remove clause from all queues
    for (unsigned i = 0; i < _queues.size(); i++)
    {
      _queues[i]->remove(cl);
    }
  }

  selectedEvent.fire(cl);

  return cl;
}